

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O3

base_learner * cs_active_setup(options_i *options,vw *all)

{
  uint32_t *location;
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  options_i *poVar3;
  float *pfVar4;
  vw *all_00;
  int iVar5;
  cs_active *pcVar6;
  option_group_definition *poVar7;
  typed_option<int> *ptVar8;
  typed_option<float> *ptVar9;
  _func_int ***__dest;
  typed_option<unsigned_long> *ptVar10;
  base_learner *pbVar11;
  learner<char,_example> *base;
  learner<cs_active,_example> *plVar12;
  vw_exception *pvVar13;
  long lVar14;
  code *predict;
  code *learn;
  uint uVar15;
  undefined **ppuVar16;
  label_parser *plVar17;
  byte bVar18;
  bool simulation;
  int domination;
  size_type __dnew_11;
  option_group_definition new_options;
  size_type __dnew;
  string loss_function_type;
  size_type __dnew_10;
  size_type __dnew_2;
  size_type __dnew_9;
  size_type __dnew_8;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_5;
  size_type __dnew_4;
  size_type __dnew_3;
  bool local_12c9;
  options_i *local_12c8;
  cs_active *local_12c0;
  int local_12b4;
  _func_int ***local_12b0;
  _func_int **local_12a8;
  _func_int **local_12a0 [2];
  float *local_1290;
  float *local_1288;
  vw *local_1280;
  long local_1278;
  _func_int ***local_1270;
  _func_int **local_1268;
  _func_int **local_1260 [2];
  _func_int ***local_1250;
  _func_int **local_1248;
  _func_int **local_1240 [2];
  _func_int ***local_1230;
  _func_int **local_1228;
  _func_int **local_1220 [2];
  _func_int ***local_1210;
  _func_int **local_1208;
  _func_int **local_1200 [2];
  _func_int ***local_11f0;
  _func_int **local_11e8;
  _func_int **local_11e0 [2];
  _func_int ***local_11d0;
  _func_int **local_11c8;
  _func_int **local_11c0 [2];
  _func_int ***local_11b0;
  _func_int **local_11a8;
  _func_int **local_11a0 [2];
  _func_int ***local_1190;
  _func_int **local_1188;
  _func_int **local_1180 [2];
  _func_int ***local_1170;
  _func_int **local_1168;
  _func_int **local_1160 [2];
  _func_int ***local_1150;
  _func_int **local_1148;
  _func_int **local_1140 [2];
  option_group_definition local_1130;
  string local_10f8;
  string local_10d8;
  string local_10b8;
  string local_1098;
  string local_1078;
  string local_1058;
  string local_1038;
  string local_1018;
  string local_ff8;
  long *local_fd8;
  long local_fd0;
  long local_fc8 [2];
  undefined1 local_fb8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fa0;
  string local_f88 [64];
  bool local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f20;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  undefined1 local_d50 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cb8;
  undefined1 local_cb0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c18;
  undefined1 local_c10 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b78;
  typed_option<float> local_b70;
  typed_option<float> local_ad0;
  typed_option<unsigned_long> local_a30;
  typed_option<unsigned_long> local_990;
  typed_option<float> local_8f0;
  typed_option<float> local_850;
  typed_option<int> local_7b0;
  typed_option<bool> local_710;
  typed_option<float> local_670;
  typed_option<float> local_5d0;
  typed_option<unsigned_long> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<float> local_3f0;
  typed_option<float> local_350;
  typed_option<int> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar18 = 0;
  local_1280 = all;
  pcVar6 = calloc_or_throw<cs_active>(1);
  memset(pcVar6,0,0xa8);
  local_12c9 = false;
  local_fb8._0_8_ = (_func_int **)0x1e;
  local_12c0 = pcVar6;
  local_12b0 = local_12a0;
  local_12b0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_12b0,(ulong)local_fb8)
  ;
  local_12a0[0] = (_func_int **)local_fb8._0_8_;
  builtin_strncpy((char *)((long)local_12b0 + 0xe)," Active ",8);
  builtin_strncpy((char *)((long)local_12b0 + 0x16),"Learning",8);
  *(undefined4 *)local_12b0 = 0x74736f43;
  builtin_strncpy((char *)((long)local_12b0 + 4),"-sen",4);
  *(undefined4 *)(local_12b0 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_12b0 + 0xc),"ve A",4);
  local_12a8 = (_func_int **)local_fb8._0_8_;
  *(char *)((long)local_12b0 + local_fb8._0_8_) = '\0';
  local_1130.m_name._M_dataplus._M_p = (pointer)&local_1130.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1130,local_12b0,(char *)(local_fb8._0_8_ + (long)local_12b0));
  local_1130.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1130.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1130.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_12b0 != local_12a0) {
    operator_delete(local_12b0);
  }
  local_ff8._M_dataplus._M_p = (pointer)&local_ff8.field_2;
  local_ff8.field_2._M_allocated_capacity = 0x76697463615f7363;
  local_ff8.field_2._8_2_ = 0x65;
  local_ff8._M_string_length = 9;
  location = &pcVar6->num_classes;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_fb8,&local_ff8,location);
  local_f48 = true;
  local_1150 = local_1140;
  local_d50._0_8_ = (_func_int **)0x2d;
  local_1150 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1150,(ulong)local_d50)
  ;
  local_1140[0] = (_func_int **)local_d50._0_8_;
  builtin_strncpy((char *)((long)local_1150 + 0x1d),"g with <",8);
  builtin_strncpy((char *)((long)local_1150 + 0x25),"k> costs",8);
  local_1150[2] = (_func_int **)0x656c206576697463;
  local_1150[3] = (_func_int **)0x7720676e696e7261;
  *local_1150 = (_func_int **)0x6e65732d74736f43;
  local_1150[1] = (_func_int **)0x6120657669746973;
  local_1148 = (_func_int **)local_d50._0_8_;
  *(char *)((long)local_1150 + local_d50._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_f88);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_fb8);
  poVar7 = VW::config::option_group_definition::add<unsigned_int>(&local_1130,&local_d0);
  local_1018._M_dataplus._M_p = (pointer)&local_1018.field_2;
  local_1018.field_2._M_allocated_capacity = 0x6974616c756d6973;
  local_1018.field_2._8_2_ = 0x6e6f;
  local_1018._M_string_length = 10;
  local_1018.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d50,&local_1018,&local_12c9);
  local_1170 = local_1160;
  local_c10._0_8_ = (_func_int **)0x2e;
  local_1170 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1170,(ulong)local_c10)
  ;
  local_1160[0] = (_func_int **)local_c10._0_8_;
  builtin_strncpy((char *)((long)local_1170 + 0x1e)," simulat",8);
  builtin_strncpy((char *)((long)local_1170 + 0x26),"ion mode",8);
  local_1170[2] = (_func_int **)0x656c206576697463;
  local_1170[3] = (_func_int **)0x7320676e696e7261;
  *local_1170 = (_func_int **)0x6e65732d74736f63;
  local_1170[1] = (_func_int **)0x6120657669746973;
  local_1168 = (_func_int **)local_c10._0_8_;
  *(char *)((long)local_1170 + local_c10._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d50 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_d50);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_170);
  local_1038._M_dataplus._M_p = (pointer)&local_1038.field_2;
  local_1038.field_2._M_allocated_capacity = 0x656e696c65736162;
  local_1038._M_string_length = 8;
  local_1038.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_c10,&local_1038,&pcVar6->is_baseline);
  local_1190 = local_1180;
  local_7b0.super_base_option._vptr_base_option = (_func_int **)0x27;
  local_1190 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1190,(ulong)&local_7b0);
  local_1180[0] = local_7b0.super_base_option._vptr_base_option;
  local_1190[2] = (_func_int **)0x656c206576697463;
  local_1190[3] = (_func_int **)0x6220676e696e7261;
  *local_1190 = (_func_int **)0x6e65732d74736f63;
  local_1190[1] = (_func_int **)0x6120657669746973;
  builtin_strncpy((char *)((long)local_1190 + 0x1f),"baseline",8);
  local_1188 = local_7b0.super_base_option._vptr_base_option;
  *(char *)((long)local_1190 + (long)local_7b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_c10 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_c10);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_210);
  local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
  local_1058.field_2._M_allocated_capacity = 0x6974616e696d6f64;
  local_1058.field_2._8_2_ = 0x6e6f;
  local_1058._M_string_length = 10;
  local_1058.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<int>::typed_option(&local_7b0,&local_1058,&local_12b4);
  ptVar8 = VW::config::typed_option<int>::default_value(&local_7b0,1);
  local_11b0 = local_11a0;
  local_850.super_base_option._vptr_base_option = (_func_int **)0x38;
  local_11b0 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_11b0,(ulong)&local_850);
  local_11a0[0] = local_850.super_base_option._vptr_base_option;
  local_11b0[4] = (_func_int **)0x6e696d6f64206573;
  local_11b0[5] = (_func_int **)0x44202e6e6f697461;
  local_11b0[2] = (_func_int **)0x656c206576697463;
  local_11b0[3] = (_func_int **)0x7520676e696e7261;
  *local_11b0 = (_func_int **)0x6e65732d74736f63;
  local_11b0[1] = (_func_int **)0x6120657669746973;
  local_11b0[6] = (_func_int **)0x3120746c75616665;
  local_11a8 = local_850.super_base_option._vptr_base_option;
  *(char *)((long)local_11b0 + (long)local_850.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_2b0,ptVar8);
  poVar7 = VW::config::option_group_definition::add<int>(poVar7,&local_2b0);
  local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
  local_1078.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_1078.field_2._8_2_ = 0x7373;
  local_1078._M_string_length = 10;
  local_1078.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_850,&local_1078,&pcVar6->c0);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_850,0.1);
  local_11d0 = local_11c0;
  local_8f0.super_base_option._vptr_base_option = (_func_int **)0x26;
  local_11d0 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_11d0,(ulong)&local_8f0);
  local_11c0[0] = local_8f0.super_base_option._vptr_base_option;
  local_11d0[2] = (_func_int **)0x305f632072657465;
  local_11d0[3] = (_func_int **)0x6c7561666544202e;
  *local_11d0 = (_func_int **)0x656e776f6c6c656d;
  local_11d0[1] = (_func_int **)0x6d61726170207373;
  builtin_strncpy((char *)((long)local_11d0 + 0x1e),"ult 0.1.",8);
  local_11c8 = local_8f0.super_base_option._vptr_base_option;
  *(char *)((long)local_11d0 + (long)local_8f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_350,ptVar9);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_350);
  local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
  local_1098.field_2._M_allocated_capacity._0_4_ = 0x676e6172;
  local_1098.field_2._M_allocated_capacity._4_3_ = 0x635f65;
  local_1098._M_string_length = 7;
  local_1098.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option(&local_8f0,&local_1098,&pcVar6->c1);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_8f0,0.5);
  local_11f0 = local_11e0;
  local_990.super_base_option._vptr_base_option = (_func_int **)0x50;
  local_12c8 = options;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_11f0,(ulong)&local_990);
  pp_Var2 = local_990.super_base_option._vptr_base_option;
  local_11e0[0] = local_990.super_base_option._vptr_base_option;
  local_11f0 = __dest;
  memcpy(__dest,"parameter controlling the threshold for per-label cost uncertainty. Default 0.5.",
         0x50);
  local_11e8 = pp_Var2;
  *(undefined1 *)((long)__dest + (long)pp_Var2) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar9);
  pcVar6 = local_12c0;
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_3f0);
  local_10b8._M_dataplus._M_p = (pointer)&local_10b8.field_2;
  local_10b8.field_2._M_allocated_capacity = 0x6562616c5f78616d;
  local_10b8.field_2._8_2_ = 0x736c;
  local_10b8._M_string_length = 10;
  local_10b8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option(&local_990,&local_10b8,&pcVar6->max_labels);
  ptVar10 = VW::config::typed_option<unsigned_long>::default_value(&local_990,0xffffffffffffffff);
  local_1210 = local_1200;
  local_a30.super_base_option._vptr_base_option = (_func_int **)0x20;
  local_1210 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1210,(ulong)&local_a30);
  local_1200[0] = local_a30.super_base_option._vptr_base_option;
  local_1210[2] = (_func_int **)0x206c6562616c2066;
  local_1210[3] = (_func_int **)0x2e73656972657571;
  *local_1210 = (_func_int **)0x206d756d6978616d;
  local_1210[1] = (_func_int **)0x6f207265626d756e;
  local_1208 = local_a30.super_base_option._vptr_base_option;
  *(char *)((long)local_1210 + (long)local_a30.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_490,ptVar10);
  poVar7 = VW::config::option_group_definition::add<unsigned_long>(poVar7,&local_490);
  local_10d8._M_dataplus._M_p = (pointer)&local_10d8.field_2;
  local_10d8.field_2._M_allocated_capacity = 0x6562616c5f6e696d;
  local_10d8.field_2._8_2_ = 0x736c;
  local_10d8._M_string_length = 10;
  local_10d8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option(&local_a30,&local_10d8,&pcVar6->min_labels);
  ptVar10 = VW::config::typed_option<unsigned_long>::default_value(&local_a30,0xffffffffffffffff);
  local_1230 = local_1220;
  local_ad0.super_base_option._vptr_base_option = (_func_int **)0x20;
  local_1230 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1230,(ulong)&local_ad0);
  local_1220[0] = local_ad0.super_base_option._vptr_base_option;
  local_1230[2] = (_func_int **)0x206c6562616c2066;
  local_1230[3] = (_func_int **)0x2e73656972657571;
  *local_1230 = (_func_int **)0x206d756d696e696d;
  local_1230[1] = (_func_int **)0x6f207265626d756e;
  local_1228 = local_ad0.super_base_option._vptr_base_option;
  *(char *)((long)local_1230 + (long)local_ad0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_530,ptVar10);
  poVar7 = VW::config::option_group_definition::add<unsigned_long>(poVar7,&local_530);
  local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
  local_10f8.field_2._M_allocated_capacity = 0x78616d5f74736f63;
  local_10f8._M_string_length = 8;
  local_10f8.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<float>::typed_option(&local_ad0,&local_10f8,&pcVar6->cost_max);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_ad0,1.0);
  local_1250 = local_1240;
  local_b70.super_base_option._vptr_base_option = (_func_int **)0x1c;
  local_1250 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1250,(ulong)&local_b70);
  local_1240[0] = local_b70.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_1250 + 0xc),"ound. De",8);
  builtin_strncpy((char *)((long)local_1250 + 0x14),"fault 1.",8);
  *local_1250 = (_func_int **)0x7070752074736f63;
  local_1250[1] = (_func_int **)0x646e756f62207265;
  local_1248 = local_b70.super_base_option._vptr_base_option;
  *(char *)((long)local_1250 + (long)local_b70.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_5d0,ptVar9);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_5d0);
  local_e10.field_2._M_allocated_capacity = 0x6e696d5f74736f63;
  local_e10._M_string_length = 8;
  local_e10.field_2._M_local_buf[8] = '\0';
  local_1288 = &pcVar6->cost_min;
  local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
  VW::config::typed_option<float>::typed_option(&local_b70,&local_e10,local_1288);
  ptVar9 = VW::config::typed_option<float>::default_value(&local_b70,0.0);
  local_1270 = local_1260;
  local_cb0._0_8_ = (_func_int **)0x1c;
  local_1270 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1270,(ulong)local_cb0)
  ;
  local_1260[0] = (_func_int **)local_cb0._0_8_;
  builtin_strncpy((char *)((long)local_1270 + 0xc),"ound. De",8);
  builtin_strncpy((char *)((long)local_1270 + 0x14),"fault 0.",8);
  *local_1270 = (_func_int **)0x776f6c2074736f63;
  local_1270[1] = (_func_int **)0x646e756f62207265;
  local_1268 = (_func_int **)local_cb0._0_8_;
  *(char *)((long)local_1270 + local_cb0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_670,ptVar9);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_670);
  local_e30.field_2._M_allocated_capacity = 0x756265645f617363;
  local_e30.field_2._8_2_ = 0x67;
  local_e30._M_string_length = 9;
  local_1290 = &pcVar6->cost_max;
  local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_cb0,&local_e30,&pcVar6->print_debug_stuff);
  local_1278 = 0x1f;
  local_fd8 = local_fc8;
  local_fd8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_fd8,(ulong)&local_1278);
  local_fc8[0] = local_1278;
  builtin_strncpy((char *)((long)local_fd8 + 0xf),"ff for c",8);
  builtin_strncpy((char *)((long)local_fd8 + 0x17),"s_active",8);
  *local_fd8 = 0x656420746e697270;
  local_fd8[1] = 0x6675747320677562;
  local_fd0 = local_1278;
  *(char *)((long)local_fd8 + local_1278) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_cb0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_710,(typed_option<bool> *)local_cb0);
  VW::config::option_group_definition::add<bool>(poVar7,&local_710);
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_fd8 != local_fc8) {
    operator_delete(local_fd8);
  }
  local_cb0._0_8_ = &PTR__typed_option_002d1618;
  if (local_c18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c18._M_pi);
  }
  if (local_c28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c28._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_cb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
    operator_delete(local_e30._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_1270 != local_1260) {
    operator_delete(local_1270);
  }
  local_b70.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_b70.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b70.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_b70.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
    operator_delete(local_e10._M_dataplus._M_p);
  }
  all_00 = local_1280;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_1250 != local_1240) {
    operator_delete(local_1250);
  }
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_ad0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ad0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_530.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_1230 != local_1220) {
    operator_delete(local_1230);
  }
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_a30.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
    operator_delete(local_10d8._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_490.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_1210 != local_1200) {
    operator_delete(local_1210);
  }
  local_990.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_990.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_990.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
    operator_delete(local_10b8._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_11f0 != local_11e0) {
    operator_delete(local_11f0);
  }
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_8f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_11d0 != local_11c0) {
    operator_delete(local_11d0);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1ef8;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_11b0 != local_11a0) {
    operator_delete(local_11b0);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1ef8;
  if (local_7b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_1190 != local_1180) {
    operator_delete(local_1190);
  }
  local_c10._0_8_ = &PTR__typed_option_002d1618;
  if (local_b78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b78._M_pi);
  }
  if (local_b88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b88._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038._M_dataplus._M_p != &local_1038.field_2) {
    operator_delete(local_1038._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_1170 != local_1160) {
    operator_delete(local_1170);
  }
  local_d50._0_8_ = &PTR__typed_option_002d1618;
  if (local_cb8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cb8._M_pi);
  }
  if (local_cc8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cc8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
    operator_delete(local_1018._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1728;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1150 != local_1140) {
    operator_delete(local_1150);
  }
  local_fb8._0_8_ = &PTR__typed_option_002d1728;
  if (local_f20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f20._M_pi);
  }
  if (local_f30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f30._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
    operator_delete(local_ff8._M_dataplus._M_p);
  }
  poVar3 = local_12c8;
  (**local_12c8->_vptr_options_i)(local_12c8,&local_1130);
  pcVar6->use_domination = true;
  pp_Var2 = (_func_int **)(local_fb8 + 0x10);
  local_fb8._16_8_ = 0x6974616e696d6f64;
  local_fb8._8_8_ = (pointer)0xa;
  local_fa0._M_allocated_capacity._0_3_ = 0x6e6f;
  local_fb8._0_8_ = pp_Var2;
  iVar5 = (*poVar3->_vptr_options_i[1])(poVar3,local_fb8);
  if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
    operator_delete((void *)local_fb8._0_8_);
  }
  if (((byte)iVar5 & local_12b4 == 0) != 0) {
    pcVar6->use_domination = false;
  }
  local_fb8._16_8_ = 0x76697463615f7363;
  local_fa0._M_allocated_capacity._0_2_ = 0x65;
  local_fb8._8_8_ = (pointer)0x9;
  local_fb8._0_8_ = pp_Var2;
  iVar5 = (*local_12c8->_vptr_options_i[1])();
  if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
    operator_delete((void *)local_fb8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar12 = (learner<cs_active,_example> *)0x0;
  }
  else {
    pcVar6->all = all_00;
    pcVar6->t = 1;
    (**all_00->loss->_vptr_loss_function)(local_d50);
    iVar5 = std::__cxx11::string::compare(local_d50);
    if (iVar5 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_fb8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_fb8 + 0x10),
                 "error: you can\'t use non-squared loss with cs_active",0x34);
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x158,&local_d70);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_fb8._16_4_ = 0x61646c;
    local_fb8._8_8_ = (pointer)0x3;
    local_fb8._0_8_ = pp_Var2;
    iVar5 = (*local_12c8->_vptr_options_i[1])();
    if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
      operator_delete((void *)local_fb8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_fb8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_fb8 + 0x10),"error: you can\'t combine lda and active learning",
                 0x30);
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15b,&local_d90);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_fb8._8_8_ = (pointer)0x6;
    local_fb8._16_7_ = 0x657669746361;
    local_fb8._0_8_ = pp_Var2;
    iVar5 = (*local_12c8->_vptr_options_i[1])();
    if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
      operator_delete((void *)local_fb8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_fb8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_fb8 + 0x10),
                 "error: you can\'t use --cs_active and --active at the same time",0x3e);
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15e,&local_db0);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_fb8._16_8_ = 0x635f657669746361;
    local_fa0._M_allocated_capacity._0_4_ = 0x7265766f;
    local_fb8._8_8_ = (pointer)0xc;
    local_fa0._M_local_buf[4] = '\0';
    local_fb8._0_8_ = pp_Var2;
    iVar5 = (*local_12c8->_vptr_options_i[1])();
    if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
      operator_delete((void *)local_fb8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_fb8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_fb8 + 0x10),
                 "error: you can\'t use --cs_active and --active_cover at the same time",0x44);
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x161,&local_dd0);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_fb8._16_6_ = 0x61616f7363;
    local_fb8._8_8_ = (pointer)0x5;
    local_fb8._0_8_ = pp_Var2;
    iVar5 = (*local_12c8->_vptr_options_i[1])();
    if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
      operator_delete((void *)local_fb8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_fb8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_fb8 + 0x10),
                 "error: you can\'t use --cs_active and --csoaa at the same time",0x3d);
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x164,&local_df0);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_fb8._8_8_ = (pointer)0x4;
    local_fb8._16_5_ = 0x78616461;
    local_fb8._0_8_ = pp_Var2;
    iVar5 = (*local_12c8->_vptr_options_i[1])();
    if ((_func_int **)local_fb8._0_8_ != pp_Var2) {
      operator_delete((void *)local_fb8._0_8_);
    }
    pfVar4 = local_1290;
    if ((char)iVar5 == '\0') {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"WARNING: --cs_active should be used with --adax",0x2f);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    ppuVar16 = &COST_SENSITIVE::cs_label;
    plVar17 = &all_00->p->lp;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      plVar17->default_label = (_func_void_void_ptr *)*ppuVar16;
      ppuVar16 = ppuVar16 + (ulong)bVar18 * -2 + 1;
      plVar17 = (label_parser *)((long)plVar17 + (ulong)bVar18 * -0x10 + 8);
    }
    (*all_00->set_minmax)(all_00->sd,*pfVar4);
    (*all_00->set_minmax)(all_00->sd,*local_1288);
    if (*location != 0xffffffff) {
      uVar15 = 0;
      do {
        local_fb8._0_8_ = (_func_int **)0x0;
        v_array<unsigned_long>::push_back(&pcVar6->examples_by_queries,(unsigned_long *)local_fb8);
        uVar15 = uVar15 + 1;
      } while (uVar15 < *location + 1);
    }
    if (local_12c9 == false) {
      pbVar11 = setup_base(local_12c8,all_00);
      base = LEARNER::as_singleline<char,char>(pbVar11);
      predict = predict_or_learn<false,false>;
      learn = predict_or_learn<true,false>;
    }
    else {
      pbVar11 = setup_base(local_12c8,all_00);
      base = LEARNER::as_singleline<char,char>(pbVar11);
      predict = predict_or_learn<false,true>;
      learn = predict_or_learn<true,true>;
    }
    plVar12 = LEARNER::learner<cs_active,example>::init_learner<LEARNER::learner<char,example>>
                        (local_12c0,base,learn,predict,(ulong)local_12c0->num_classes,multilabels);
    *(undefined8 *)(plVar12 + 0x58) = *(undefined8 *)(plVar12 + 0x18);
    *(code **)(plVar12 + 0x68) = finish_example;
    *(undefined8 *)(plVar12 + 0xb8) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0xc0) = *(undefined8 *)(plVar12 + 0x20);
    *(code **)(plVar12 + 200) = finish;
    all_00->cost_sensitive = (base_learner *)plVar12;
    if ((undefined1 *)local_d50._0_8_ != local_d50 + 0x10) {
      operator_delete((void *)local_d50._0_8_);
    }
    local_12c0 = (cs_active *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1130.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130.m_name._M_dataplus._M_p != &local_1130.m_name.field_2) {
    operator_delete(local_1130.m_name._M_dataplus._M_p);
  }
  if (local_12c0 != (cs_active *)0x0) {
    free(local_12c0);
  }
  return (base_learner *)plVar12;
}

Assistant:

base_learner* cs_active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cs_active>();

  bool simulation = false;
  int domination;
  option_group_definition new_options("Cost-sensitive Active Learning");
  new_options
      .add(make_option("cs_active", data->num_classes).keep().help("Cost-sensitive active learning with <k> costs"))
      .add(make_option("simulation", simulation).help("cost-sensitive active learning simulation mode"))
      .add(make_option("baseline", data->is_baseline).help("cost-sensitive active learning baseline"))
      .add(make_option("domination", domination)
               .default_value(1)
               .help("cost-sensitive active learning use domination. Default 1"))
      .add(make_option("mellowness", data->c0).default_value(0.1f).help("mellowness parameter c_0. Default 0.1."))
      .add(make_option("range_c", data->c1)
               .default_value(0.5f)
               .help("parameter controlling the threshold for per-label cost uncertainty. Default 0.5."))
      .add(make_option("max_labels", data->max_labels).default_value(-1).help("maximum number of label queries."))
      .add(make_option("min_labels", data->min_labels).default_value(-1).help("minimum number of label queries."))
      .add(make_option("cost_max", data->cost_max).default_value(1.f).help("cost upper bound. Default 1."))
      .add(make_option("cost_min", data->cost_min).default_value(0.f).help("cost lower bound. Default 0."))
      // TODO replace with trace and quiet
      .add(make_option("csa_debug", data->print_debug_stuff).help("print debug stuff for cs_active"));
  options.add_and_parse(new_options);

  data->use_domination = true;
  if (options.was_supplied("domination") && !domination)
    data->use_domination = false;

  if (!options.was_supplied("cs_active"))
    return nullptr;

  data->all = &all;
  data->t = 1;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "squared")
    THROW("error: you can't use non-squared loss with cs_active");

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --cs_active and --active at the same time");

  if (options.was_supplied("active_cover"))
    THROW("error: you can't use --cs_active and --active_cover at the same time");

  if (options.was_supplied("csoaa"))
    THROW("error: you can't use --cs_active and --csoaa at the same time");

  if (!options.was_supplied("adax"))
    all.trace_message << "WARNING: --cs_active should be used with --adax" << endl;

  all.p->lp = cs_label;  // assigning the label parser
  all.set_minmax(all.sd, data->cost_max);
  all.set_minmax(all.sd, data->cost_min);
  for (uint32_t i = 0; i < data->num_classes + 1; i++) data->examples_by_queries.push_back(0);

  learner<cs_active, example>& l = simulation
      ? init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>,
            predict_or_learn<false, true>, data->num_classes, prediction_type::multilabels)
      : init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, false>,
            predict_or_learn<false, false>, data->num_classes, prediction_type::multilabels);

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  base_learner* b = make_base(l);
  all.cost_sensitive = b;
  return b;
}